

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O1

QStringList * QCoreApplication::libraryPaths(void)

{
  Type *pTVar1;
  QStringList *in_RDI;
  QDeadlineTimer timeout;
  
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_>::
           instance();
  timeout.t2 = 0;
  timeout.type = 1;
  timeout.t1 = 0x7fffffffffffffff;
  QRecursiveMutex::tryLock(&pTVar1->libraryPathMutex,timeout);
  libraryPathsLocked();
  QRecursiveMutex::unlock(&pTVar1->libraryPathMutex);
  return in_RDI;
}

Assistant:

QStringList QCoreApplication::libraryPaths()
{
    QMutexLocker locker(&coreappdata->libraryPathMutex);
    return libraryPathsLocked();
}